

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int wb_write_padding_to_temp(archive_write *a,int64_t csize)

{
  long in_RSI;
  size_t unaff_retaddr;
  archive_write *in_stack_00000008;
  int ret;
  size_t ns;
  undefined4 local_1c;
  
  if (in_RSI % 0x800 == 0) {
    local_1c = 0;
  }
  else {
    local_1c = write_null(in_stack_00000008,unaff_retaddr);
  }
  return local_1c;
}

Assistant:

static int
wb_write_padding_to_temp(struct archive_write *a, int64_t csize)
{
	size_t ns;
	int ret;

	ns = (size_t)(csize % LOGICAL_BLOCK_SIZE);
	if (ns != 0)
		ret = write_null(a, LOGICAL_BLOCK_SIZE - ns);
	else
		ret = ARCHIVE_OK;
	return (ret);
}